

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pagerSyncHotJournal(Pager *pPager)

{
  int iVar1;
  
  iVar1 = 0;
  if (pPager->noSync == '\0') {
    iVar1 = (*pPager->jfd->pMethods->xSync)(pPager->jfd,2);
  }
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = (*pPager->jfd->pMethods->xFileSize)(pPager->jfd,&pPager->journalHdr);
  return iVar1;
}

Assistant:

static int pagerSyncHotJournal(Pager *pPager){
  int rc = SQLITE_OK;
  if( !pPager->noSync ){
    rc = sqlite3OsSync(pPager->jfd, SQLITE_SYNC_NORMAL);
  }
  if( rc==SQLITE_OK ){
    rc = sqlite3OsFileSize(pPager->jfd, &pPager->journalHdr);
  }
  return rc;
}